

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O3

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::unassign(WorkData *this,uint32_t varId,uint32_t regId)

{
  uint uVar1;
  ulong in_RCX;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint8_t uVar2;
  uint in_R8D;
  
  if (regId < 0x20) {
    uVar1 = this->_assignedRegs;
    in_RCX = (ulong)regId;
    in_R8D = 1 << ((byte)regId & 0x1f);
    if ((uVar1 >> (regId & 0x1f) & 1) == 0) goto LAB_0011d010;
    in_RCX = (ulong)regId;
    if (this->_physToVarId[in_RCX] == varId) {
      this->_physToVarId[in_RCX] = 0xff;
      this->_assignedRegs = uVar1 ^ in_R8D;
      return;
    }
  }
  else {
    unassign();
LAB_0011d010:
    unassign();
  }
  unassign();
  if (varId < 0x20) {
    return;
  }
  isAssigned();
  uVar1 = (uint)in_RCX;
  if (uVar1 < 0x20) {
    in_R8D = this->_assignedRegs;
    if ((in_R8D >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0011d090;
    if (0x1f < extraout_EDX) goto LAB_0011d095;
    uVar1 = extraout_EDX;
    if ((in_R8D >> (extraout_EDX & 0x1f) & 1) != 0) goto LAB_0011d09a;
    uVar1 = (uint)this->_physToVarId[in_RCX & 0xffffffff];
    if (this->_physToVarId[in_RCX & 0xffffffff] != varId) goto LAB_0011d09f;
    uVar1 = extraout_EDX;
    if (this->_physToVarId[extraout_EDX] == 0xff) {
      this->_physToVarId[in_RCX & 0xffffffff] = 0xff;
      this->_physToVarId[extraout_EDX] = (uint8_t)varId;
      this->_assignedRegs = 1 << ((byte)in_RCX & 0x1f) ^ 1 << ((byte)extraout_EDX & 0x1f) ^ in_R8D;
      return;
    }
  }
  else {
    reassign();
LAB_0011d090:
    reassign();
LAB_0011d095:
    reassign();
LAB_0011d09a:
    reassign();
LAB_0011d09f:
    reassign();
  }
  reassign();
  if (extraout_EDX_00 < 0x20) {
    if ((this->_assignedRegs >> (extraout_EDX_00 & 0x1f) & 1) == 0) goto LAB_0011d0ed;
    if (0x1f < in_R8D) goto LAB_0011d0f2;
    if ((this->_assignedRegs >> (in_R8D & 0x1f) & 1) == 0) goto LAB_0011d0f7;
    if (this->_physToVarId[extraout_EDX_00] != varId) goto LAB_0011d0fc;
    if (this->_physToVarId[in_R8D] == uVar1) {
      this->_physToVarId[extraout_EDX_00] = (uint8_t)uVar1;
      this->_physToVarId[in_R8D] = (uint8_t)varId;
      return;
    }
  }
  else {
    swap();
LAB_0011d0ed:
    swap();
LAB_0011d0f2:
    swap();
LAB_0011d0f7:
    swap();
LAB_0011d0fc:
    swap();
  }
  uVar2 = (uint8_t)varId;
  swap();
  if (extraout_EDX_01 < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (extraout_EDX_01 & 0x1f) & 1) == 0) {
      if (this->_physToVarId[extraout_EDX_01] == 0xff) {
        this->_physToVarId[extraout_EDX_01] = uVar2;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)extraout_EDX_01 & 0x1f);
        return;
      }
      goto LAB_0011d13f;
    }
  }
  else {
    assign();
  }
  assign();
LAB_0011d13f:
  assign();
  return;
}

Assistant:

inline void unassign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == varId);

      DebugUtils::unused(varId);
      _physToVarId[regId] = uint8_t(kVarIdNone);
      _assignedRegs ^= Support::bitMask(regId);
    }